

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O3

void __thiscall agge::tests::LayoutTests::LongSingleLineIsBrokenOnWordBounds(LayoutTests *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  wrap limiter;
  wrap limiter_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  uint *puVar4;
  long lVar5;
  float *pfVar6;
  pointer prVar7;
  factory_ptr f;
  layout l2;
  layout l1;
  char_to_index indices [6];
  int local_b7c [9];
  undefined1 local_b58 [4];
  float fStack_b54;
  float local_b50;
  undefined4 uStack_b4c;
  undefined1 local_b48 [16];
  iterator local_b38;
  positioned_glyph *ppStack_b30;
  bool local_b28;
  int local_b20 [2];
  font_factory *local_b18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b10;
  int local_b08 [24];
  undefined1 local_aa8 [4];
  float fStack_aa4;
  real_t rStack_aa0;
  undefined4 uStack_a9c;
  undefined1 local_a98 [8];
  pointer prStack_a90;
  iterator local_a88;
  positioned_glyph *ppStack_a80;
  bool local_a78;
  undefined1 local_a70 [4];
  float fStack_a6c;
  real_t rStack_a68;
  undefined4 uStack_a64;
  undefined1 local_a60 [8];
  pointer prStack_a58;
  iterator local_a50;
  positioned_glyph *ppStack_a48;
  bool local_a40;
  undefined1 local_a38 [4];
  float fStack_a34;
  float local_a30;
  undefined4 uStack_a2c;
  undefined1 local_a28 [24];
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_a10;
  undefined1 local_9f8 [32];
  undefined1 local_9d8 [24];
  _Alloc_hider local_9c0;
  char local_9b0 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_990;
  ref_text_line local_988;
  vector<int,_std::allocator<int>_> local_960;
  vector<int,_std::allocator<int>_> local_948;
  vector<int,_std::allocator<int>_> local_930;
  vector<int,_std::allocator<int>_> local_918;
  vector<int,_std::allocator<int>_> local_900;
  vector<int,_std::allocator<int>_> local_8e8;
  vector<int,_std::allocator<int>_> local_8d0;
  vector<int,_std::allocator<int>_> local_8b8;
  vector<int,_std::allocator<int>_> local_8a0;
  vector<int,_std::allocator<int>_> local_888;
  vector<int,_std::allocator<int>_> local_870;
  vector<int,_std::allocator<int>_> local_858;
  vector<int,_std::allocator<int>_> local_840;
  vector<int,_std::allocator<int>_> local_828;
  vector<int,_std::allocator<int>_> local_810;
  vector<int,_std::allocator<int>_> local_7f8;
  vector<int,_std::allocator<int>_> local_7e0;
  vector<int,_std::allocator<int>_> local_7c8;
  vector<int,_std::allocator<int>_> local_7b0;
  vector<int,_std::allocator<int>_> local_798;
  vector<int,_std::allocator<int>_> local_780;
  vector<int,_std::allocator<int>_> local_768;
  vector<int,_std::allocator<int>_> local_750;
  vector<int,_std::allocator<int>_> local_738;
  vector<int,_std::allocator<int>_> local_720;
  vector<int,_std::allocator<int>_> local_708;
  vector<int,_std::allocator<int>_> local_6f0;
  vector<int,_std::allocator<int>_> local_6d8;
  vector<int,_std::allocator<int>_> local_6c0;
  vector<int,_std::allocator<int>_> local_6a8;
  vector<int,_std::allocator<int>_> local_690;
  vector<int,_std::allocator<int>_> local_678;
  vector<int,_std::allocator<int>_> local_660;
  vector<int,_std::allocator<int>_> local_648;
  vector<int,_std::allocator<int>_> local_630;
  vector<int,_std::allocator<int>_> local_618;
  vector<int,_std::allocator<int>_> local_600;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_5e8;
  vector<int,_std::allocator<int>_> local_5d0;
  vector<int,_std::allocator<int>_> local_5b8;
  vector<int,_std::allocator<int>_> local_5a0;
  vector<int,_std::allocator<int>_> local_588;
  vector<int,_std::allocator<int>_> local_570;
  vector<int,_std::allocator<int>_> local_558;
  vector<int,_std::allocator<int>_> local_540;
  vector<int,_std::allocator<int>_> local_528;
  vector<int,_std::allocator<int>_> local_510;
  vector<int,_std::allocator<int>_> local_4f8;
  vector<int,_std::allocator<int>_> local_4e0;
  vector<int,_std::allocator<int>_> local_4c8;
  vector<int,_std::allocator<int>_> local_4b0;
  vector<int,_std::allocator<int>_> local_498;
  vector<int,_std::allocator<int>_> local_480;
  vector<int,_std::allocator<int>_> local_468;
  vector<int,_std::allocator<int>_> local_450;
  vector<int,_std::allocator<int>_> local_438;
  undefined1 local_420 [32];
  vector<agge::text_line,_std::allocator<agge::text_line>_> local_400;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_3e8;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_3d0;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_3b8;
  int local_39c [3];
  ref_text_line local_390;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_368;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_350;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_338;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_320;
  undefined4 local_308;
  undefined4 uStack_304;
  undefined4 uStack_300;
  undefined4 uStack_2fc;
  undefined4 uStack_2f8;
  uint uStack_2f4;
  undefined4 local_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  undefined4 uStack_2e0;
  uint uStack_2dc;
  ref_text_line local_2d8;
  ref_text_line local_2b0;
  vector<int,_std::allocator<int>_> local_288;
  vector<int,_std::allocator<int>_> local_270;
  vector<int,_std::allocator<int>_> local_258;
  vector<int,_std::allocator<int>_> local_240;
  vector<int,_std::allocator<int>_> local_228;
  vector<int,_std::allocator<int>_> local_210;
  layout local_1f8;
  layout local_1a8;
  glyph local_158;
  undefined8 uStack_130;
  double local_128 [31];
  
  local_158.outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x400000027;
  uStack_130 = 0x50000002e;
  local_158.outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x200000042;
  local_158.outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x300000043;
  local_158.metrics.dx = 1.58101006669199e-322;
  local_158.metrics.dy = 2.12199582307954e-314;
  local_128[0] = 7.1;
  local_128[1] = 0.0;
  local_128[2] = 0.0;
  local_128[3] = 0.0;
  local_128[4] = 0.0;
  local_128[5] = 11.0;
  local_128[6] = 0.0;
  local_128[7] = 0.0;
  local_128[8] = 0.0;
  local_128[9] = 0.0;
  local_128[10] = 12.0;
  local_128[0xb] = 0.0;
  local_128[0xc] = 0.0;
  local_128[0xd] = 0.0;
  local_128[0xe] = 0.0;
  local_128[0xf] = 13.0;
  local_128[0x10] = 0.0;
  local_128[0x11] = 0.0;
  local_128[0x12] = 0.0;
  local_128[0x13] = 0.0;
  local_128[0x14] = 3.0;
  local_128[0x15] = 0.0;
  local_128[0x16] = 0.0;
  local_128[0x17] = 0.0;
  local_128[0x18] = 0.0;
  local_128[0x19] = 3.0;
  local_128[0x1a] = 0.0;
  local_128[0x1b] = 0.0;
  local_128[0x1c] = 0.0;
  local_128[0x1d] = 0.0;
  create_single_font_factory<6ul,6ul>
            ((LayoutTests *)&local_b18,(font_metrics *)this,
             (char_to_index (*) [6])(anonymous_namespace)::c_fm1,(glyph (*) [6])&local_158);
  local_1a8._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_start = (text_line *)0x0;
  local_1a8._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_finish = (text_line *)0x0;
  local_1a8._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8._glyphs._limit = (positioned_glyph *)0x0;
  local_1a8._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8._glyphs._begin = (positioned_glyph *)0x0;
  local_1a8._glyphs._end = (positioned_glyph *)0x0;
  local_1a8._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_start = (text_line *)0x0;
  local_1f8._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_finish = (text_line *)0x0;
  local_1f8._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8._glyphs._limit = (positioned_glyph *)0x0;
  local_1f8._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8._glyphs._begin = (positioned_glyph *)0x0;
  local_1f8._glyphs._end = (positioned_glyph *)0x0;
  _local_b58 = local_b48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b58,"AAAA BBBB CC BBBB AAAA","");
  R((richtext_t *)local_9f8,(string *)local_b58);
  local_2f0 = 0x430b199a;
  uStack_2ec = 0;
  uStack_2e8 = 0;
  uStack_2e4 = 0;
  uStack_2e0 = 0;
  uStack_2dc = uStack_2dc & 0xffffff00;
  lVar5 = (ulong)uStack_2dc << 0x20;
  limiter._sow.next = (int)lVar5;
  limiter._previous_space = (bool)(char)((ulong)lVar5 >> 0x20);
  limiter._21_3_ = (int3)((ulong)lVar5 >> 0x28);
  limiter._limit = 139.1;
  limiter._eow.extent = 0.0;
  limiter._eow.next = 0;
  limiter._sow.extent = 0.0;
  layout::process<agge::limit::wrap,agge::tests::LayoutTests::font_factory>
            (&local_1a8,(richtext_t *)local_9f8,limiter,local_b18);
  if (local_9c0._M_p != local_9b0) {
    operator_delete(local_9c0._M_p);
  }
  std::
  vector<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
  ::~vector((vector<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
             *)local_9d8);
  if ((undefined1 *)local_9f8._0_8_ != local_9f8 + 0x10) {
    operator_delete((void *)local_9f8._0_8_);
  }
  if (_local_b58 != local_b48) {
    operator_delete(_local_b58);
  }
  _local_b58 = local_b48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b58,"CCC\'C BBB AA AA AAAABBB CCCC AAAA ABABABABAB.","");
  R((richtext_t *)local_9f8,(string *)local_b58);
  local_308 = 0x430b199a;
  uStack_304 = 0;
  uStack_300 = 0;
  uStack_2fc = 0;
  uStack_2f8 = 0;
  uStack_2f4 = uStack_2f4 & 0xffffff00;
  lVar5 = (ulong)uStack_2f4 << 0x20;
  limiter_00._sow.next = (int)lVar5;
  limiter_00._previous_space = (bool)(char)((ulong)lVar5 >> 0x20);
  limiter_00._21_3_ = (int3)((ulong)lVar5 >> 0x28);
  limiter_00._limit = 139.1;
  limiter_00._eow.extent = 0.0;
  limiter_00._eow.next = 0;
  limiter_00._sow.extent = 0.0;
  layout::process<agge::limit::wrap,agge::tests::LayoutTests::font_factory>
            (&local_1f8,(richtext_t *)local_9f8,limiter_00,local_b18);
  if (local_9c0._M_p != local_9b0) {
    operator_delete(local_9c0._M_p);
  }
  std::
  vector<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
  ::~vector((vector<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
             *)local_9d8);
  if ((undefined1 *)local_9f8._0_8_ != local_9f8 + 0x10) {
    operator_delete((void *)local_9f8._0_8_);
  }
  if (_local_b58 != local_b48) {
    operator_delete(_local_b58);
  }
  peVar1 = (local_b18->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (local_b18->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_210.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(4);
  local_210.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = local_210.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + 1;
  *local_210.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = 1;
  local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 1;
  local_210.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_210.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
            ((vector<int,std::allocator<int>> *)&local_210,
             (iterator)
             local_210.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish,(int *)&local_438);
  std::vector<int,_std::allocator<int>_>::vector(&local_528,&local_210);
  local_3b8.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 1;
  if (local_528.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_528.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_528,
               (iterator)
               local_528.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_3b8);
  }
  else {
    *local_528.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_528.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_528.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_510,&local_528);
  local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 1;
  if (local_510.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_510.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_510,
               (iterator)
               local_510.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_6f0);
  }
  else {
    *local_510.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_510.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_510.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_4f8,&local_510);
  local_3d0.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  if (local_4f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_4f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_4f8,
               (iterator)
               local_4f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_3d0);
  }
  else {
    *local_4f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0;
    local_4f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_4f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_4e0,&local_4f8);
  local_7c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 2;
  if (local_4e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_4e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_4e0,
               (iterator)
               local_4e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_7c8);
  }
  else {
    *local_4e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_4e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_4e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_4c8,&local_4e0);
  local_3e8.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 2;
  if (local_4c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_4c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_4c8,
               (iterator)
               local_4c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_3e8);
  }
  else {
    *local_4c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_4c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_4c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_4b0,&local_4c8);
  local_888.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 2;
  if (local_4b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_4b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_4b0,
               (iterator)
               local_4b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_888);
  }
  else {
    *local_4b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_4b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_4b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_498,&local_4b0);
  local_400.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 2;
  if (local_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_498,
               (iterator)
               local_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_400);
  }
  else {
    *local_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_480,&local_498);
  local_b20[1] = 0;
  if (local_480.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_480.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_480,
               (iterator)
               local_480.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b20 + 1);
  }
  else {
    *local_480.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0;
    local_480.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_480.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_468,&local_480);
  local_b7c[8] = 3;
  if (local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_468,
               (iterator)
               local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b7c + 8);
  }
  else {
    *local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 3;
    local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_450,&local_468);
  local_b7c[7] = 3;
  if (local_450.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_450.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_450,
               (iterator)
               local_450.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b7c + 7);
  }
  else {
    *local_450.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 3;
    local_450.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_450.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_a38,&local_450);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_9d8._0_8_ = (pointer)0x0;
  local_9d8._8_8_ = (pointer)0x0;
  local_9f8._16_8_ = 0;
  local_9f8._24_8_ = (void *)0x0;
  local_9d8[0x10] = false;
  puVar4 = (uint *)CONCAT44(fStack_a34,local_a38);
  local_9f8._0_8_ = peVar1;
  local_9f8._8_8_ = p_Var2;
  if (puVar4 != (uint *)CONCAT44(uStack_a2c,local_a30)) {
    do {
      local_b58 = (undefined1  [4])*puVar4;
      fStack_b54 = 0.0;
      local_b50 = 0.0;
      if (local_9d8._0_8_ == local_9d8._8_8_) {
        std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
        _M_realloc_insert<agge::positioned_glyph_const&>
                  ((vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> *)
                   (local_9f8 + 0x18),(iterator)local_9d8._0_8_,(positioned_glyph *)local_b58);
      }
      else {
        ((vector_r *)(local_9d8._0_8_ + 4))->dy = 0.0;
        *(ulong *)local_9d8._0_8_ = (ulong)(uint)local_b58;
        local_9d8._0_8_ = local_9d8._0_8_ + 0xc;
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != (uint *)CONCAT44(uStack_a2c,local_a30));
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_2d8,1,(value_type *)local_9f8,(allocator_type *)local_b58);
  ref_text_line::ref_text_line
            ((ref_text_line *)local_a70,0.0,10.0,132.2,
             (vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_2d8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_320,1,(value_type *)local_a70,(allocator_type *)local_b58);
  peVar1 = (local_b18->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (local_b18->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(4);
  local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + 1;
  *local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = 2;
  local_b20[0] = 2;
  local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
            ((vector<int,std::allocator<int>> *)&local_228,
             (iterator)
             local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish,local_b20);
  std::vector<int,_std::allocator<int>_>::vector(&local_5d0,&local_228);
  local_b7c[6] = 2;
  if (local_5d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_5d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_5d0,
               (iterator)
               local_5d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b7c + 6);
  }
  else {
    *local_5d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_5d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_5d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_5b8,&local_5d0);
  local_b7c[5] = 2;
  if (local_5b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_5b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_5b8,
               (iterator)
               local_5b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b7c + 5);
  }
  else {
    *local_5b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_5b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_5b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_5a0,&local_5b8);
  local_b7c[4] = 0;
  if (local_5a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_5a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_5a0,
               (iterator)
               local_5a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b7c + 4);
  }
  else {
    *local_5a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0;
    local_5a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_5a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_588,&local_5a0);
  local_b7c[3] = 1;
  if (local_588.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_588.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_588,
               (iterator)
               local_588.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b7c + 3);
  }
  else {
    *local_588.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_588.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_588.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_570,&local_588);
  local_b7c[2] = 1;
  if (local_570.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_570.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_570,
               (iterator)
               local_570.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b7c + 2);
  }
  else {
    *local_570.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_570.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_570.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_558,&local_570);
  local_b7c[1] = 1;
  if (local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_558,
               (iterator)
               local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b7c + 1);
  }
  else {
    *local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_540,&local_558);
  local_b7c[0] = 1;
  if (local_540.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_540.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_540,
               (iterator)
               local_540.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b7c);
  }
  else {
    *local_540.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_540.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_540.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_a10,&local_540);
  local_b58 = SUB84(peVar1,0);
  fStack_b54 = (float)((ulong)peVar1 >> 0x20);
  local_b50 = SUB84(p_Var3,0);
  uStack_b4c = (undefined4)((ulong)p_Var3 >> 0x20);
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  local_b38._M_current = (positioned_glyph *)0x0;
  ppStack_b30 = (positioned_glyph *)0x0;
  local_b48._0_8_ = 0;
  local_b48._8_8_ = (void *)0x0;
  local_b28 = false;
  if (local_a10.
      super__Vector_base<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_a10.
      super__Vector_base<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    prVar7 = local_a10.
             super__Vector_base<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_988._offset.dx = (prVar7->_offset).dx;
      local_988._offset.dy = 0.0;
      local_988._extent = 0.0;
      if (local_b38._M_current == ppStack_b30) {
        std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
        _M_realloc_insert<agge::positioned_glyph_const&>
                  ((vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> *)
                   (local_b48 + 8),local_b38,(positioned_glyph *)&local_988);
      }
      else {
        ((local_b38._M_current)->d).dy = 0.0;
        (local_b38._M_current)->index = (int)(ulong)(uint)local_988._offset.dx;
        ((local_b38._M_current)->d).dx = (float)(int)((ulong)(uint)local_988._offset.dx >> 0x20);
        local_b38._M_current = local_b38._M_current + 1;
      }
      prVar7 = (pointer)&(prVar7->_offset).dy;
    } while (prVar7 != local_a10.
                       super__Vector_base<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             local_420,1,(value_type *)local_b58,(allocator_type *)&local_988);
  ref_text_line::ref_text_line
            ((ref_text_line *)local_aa8,0.0,24.0,99.1,
             (vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             local_420);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::push_back
            (&local_320,(value_type *)local_aa8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_2b0,&local_320);
  std::vector<agge::text_line,std::allocator<agge::text_line>>::
  vector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>,void>
            ((vector<agge::text_line,std::allocator<agge::text_line>> *)&local_5e8,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_1a8._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_1a8._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_finish,(allocator_type *)&local_988);
  local_390._offset = (vector_r)&local_390._glyph_runs;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_390,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)&local_988,(string *)&local_390,0x17f);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_2b0,(vector<agge::text_line,_std::allocator<agge::text_line>_> *)&local_5e8,
             (LocationInfo *)&local_988);
  if ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
      CONCAT44(local_988._offset.dy,local_988._offset.dx) != &local_988._glyph_runs) {
    operator_delete((undefined1 *)CONCAT44(local_988._offset.dy,local_988._offset.dx));
  }
  if (local_390._offset != (vector_r)&local_390._glyph_runs) {
    operator_delete((void *)local_390._offset);
  }
  if (local_5e8.
      super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5e8.
                    super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_2b0);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             local_a98);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             local_420);
  if ((void *)local_b48._8_8_ != (void *)0x0) {
    operator_delete((void *)local_b48._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_b4c,local_b50) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_b4c,local_b50));
  }
  if (local_a10.
      super__Vector_base<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a10.
                    super__Vector_base<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_540.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_540.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_570.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_570.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_588.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_588.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_5a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_5a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_5b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_5b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_5d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_5d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_320);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             local_a60);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_2d8);
  if ((void *)local_9f8._24_8_ != (void *)0x0) {
    operator_delete((void *)local_9f8._24_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9f8._8_8_);
  }
  if ((void *)CONCAT44(fStack_a34,local_a38) != (void *)0x0) {
    operator_delete((void *)CONCAT44(fStack_a34,local_a38));
  }
  if (local_450.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_450.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_468.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_480.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_480.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_4b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_4b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_4c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_4c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_4e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_4e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_4f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_4f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_510.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_510.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_528.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_528.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_210.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_210.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  peVar1 = (local_b18->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (local_b18->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_990 = p_Var2;
  local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(4);
  local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + 1;
  *local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = 3;
  local_b20[1] = 3;
  local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
            ((vector<int,std::allocator<int>> *)&local_240,
             (iterator)
             local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish,local_b20 + 1);
  std::vector<int,_std::allocator<int>_>::vector(&local_6d8,&local_240);
  local_b7c[8] = 3;
  if (local_6d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_6d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_6d8,
               (iterator)
               local_6d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b7c + 8);
  }
  else {
    *local_6d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 3;
    local_6d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_6d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_6c0,&local_6d8);
  local_b7c[7] = 4;
  if (local_6c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_6c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_6c0,
               (iterator)
               local_6c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b7c + 7);
  }
  else {
    *local_6c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 4;
    local_6c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_6c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_6a8,&local_6c0);
  local_b20[0] = 3;
  if (local_6a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_6a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_6a8,
               (iterator)
               local_6a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b20);
  }
  else {
    *local_6a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 3;
    local_6a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_6a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_690,&local_6a8);
  local_b7c[6] = 0;
  if (local_690.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_690.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_690,
               (iterator)
               local_690.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b7c + 6);
  }
  else {
    *local_690.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0;
    local_690.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_690.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_678,&local_690);
  local_b7c[5] = 2;
  if (local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_678,
               (iterator)
               local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b7c + 5);
  }
  else {
    *local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_660,&local_678);
  local_b7c[4] = 2;
  if (local_660.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_660.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_660,
               (iterator)
               local_660.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b7c + 4);
  }
  else {
    *local_660.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_660.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_660.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_648,&local_660);
  local_b7c[3] = 2;
  if (local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_648,
               (iterator)
               local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b7c + 3);
  }
  else {
    *local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_630,&local_648);
  local_b7c[2] = 0;
  if (local_630.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_630.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_630,
               (iterator)
               local_630.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b7c + 2);
  }
  else {
    *local_630.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0;
    local_630.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_630.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_618,&local_630);
  local_b7c[1] = 1;
  if (local_618.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_618.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_618,
               (iterator)
               local_618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b7c + 1);
  }
  else {
    *local_618.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_618.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_600,&local_618);
  local_b7c[0] = 1;
  if (local_600.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_600.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_600,
               (iterator)
               local_600.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b7c);
  }
  else {
    *local_600.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_600.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_600.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_438,&local_600);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_9d8._0_8_ = (pointer)0x0;
  local_9d8._8_8_ = (pointer)0x0;
  local_9f8._16_8_ = 0;
  local_9f8._24_8_ = (void *)0x0;
  local_9d8[0x10] = false;
  puVar4 = (uint *)CONCAT44(local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  local_9f8._0_8_ = peVar1;
  local_9f8._8_8_ = p_Var2;
  if (puVar4 != (uint *)local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish) {
    do {
      local_b58 = (undefined1  [4])*puVar4;
      fStack_b54 = 0.0;
      local_b50 = 0.0;
      if (local_9d8._0_8_ == local_9d8._8_8_) {
        std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
        _M_realloc_insert<agge::positioned_glyph_const&>
                  ((vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> *)
                   (local_9f8 + 0x18),(iterator)local_9d8._0_8_,(positioned_glyph *)local_b58);
      }
      else {
        ((vector_r *)(local_9d8._0_8_ + 4))->dy = 0.0;
        *(ulong *)local_9d8._0_8_ = (ulong)(uint)local_b58;
        local_9d8._0_8_ = local_9d8._0_8_ + 0xc;
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != (uint *)local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_5e8,1,(value_type *)local_9f8,(allocator_type *)local_b58);
  ref_text_line::ref_text_line(&local_988,0.0,10.0,127.2,&local_5e8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_368,1,&local_988,(allocator_type *)local_b58);
  peVar1 = (local_b18->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (local_b18->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(4);
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + 1;
  *local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = 1;
  local_39c[2] = 1;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
            ((vector<int,std::allocator<int>> *)&local_258,
             (iterator)
             local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish,local_39c + 2);
  std::vector<int,_std::allocator<int>_>::vector(&local_7b0,&local_258);
  local_b08[0x17] = 0;
  if (local_7b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_7b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_7b0,
               (iterator)
               local_7b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b08 + 0x17);
  }
  else {
    *local_7b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0;
    local_7b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_7b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_798,&local_7b0);
  local_b08[0x16] = 1;
  if (local_798.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_798.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_798,
               (iterator)
               local_798.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b08 + 0x16);
  }
  else {
    *local_798.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_798.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_798.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_780,&local_798);
  local_b08[0x15] = 1;
  if (local_780.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_780.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_780,
               (iterator)
               local_780.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b08 + 0x15);
  }
  else {
    *local_780.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_780.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_780.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_768,&local_780);
  local_b08[0x14] = 1;
  if (local_768.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_768.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_768,
               (iterator)
               local_768.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b08 + 0x14);
  }
  else {
    *local_768.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_768.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_768.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_750,&local_768);
  local_b08[0x13] = 1;
  if (local_750.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_750.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_750,
               (iterator)
               local_750.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b08 + 0x13);
  }
  else {
    *local_750.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_750.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_750.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_738,&local_750);
  local_b08[0x12] = 2;
  if (local_738.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_738.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_738,
               (iterator)
               local_738.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b08 + 0x12);
  }
  else {
    *local_738.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_738.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_738.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_720,&local_738);
  local_b08[0x11] = 2;
  if (local_720.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_720.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_720,
               (iterator)
               local_720.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b08 + 0x11);
  }
  else {
    *local_720.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_720.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_720.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_708,&local_720);
  local_b08[0x10] = 2;
  if (local_708.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_708.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_708,
               (iterator)
               local_708.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b08 + 0x10);
  }
  else {
    *local_708.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_708.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_708.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_6f0,&local_708);
  local_b58 = SUB84(peVar1,0);
  fStack_b54 = (float)((ulong)peVar1 >> 0x20);
  local_b50 = SUB84(p_Var2,0);
  uStack_b4c = (undefined4)((ulong)p_Var2 >> 0x20);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_b38._M_current = (positioned_glyph *)0x0;
  ppStack_b30 = (positioned_glyph *)0x0;
  local_b48._0_8_ = 0;
  local_b48._8_8_ = (void *)0x0;
  local_b28 = false;
  pfVar6 = (float *)CONCAT44(local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._0_4_);
  if (pfVar6 != (float *)local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish) {
    do {
      local_a70 = (undefined1  [4])*pfVar6;
      fStack_a6c = 0.0;
      rStack_a68 = 0.0;
      if (local_b38._M_current == ppStack_b30) {
        std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
        _M_realloc_insert<agge::positioned_glyph_const&>
                  ((vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> *)
                   (local_b48 + 8),local_b38,(positioned_glyph *)local_a70);
      }
      else {
        ((local_b38._M_current)->d).dy = 0.0;
        (local_b38._M_current)->index = (int)(ulong)(uint)local_a70;
        ((local_b38._M_current)->d).dx = (float)(int)((ulong)(uint)local_a70 >> 0x20);
        local_b38._M_current = local_b38._M_current + 1;
      }
      pfVar6 = pfVar6 + 1;
    } while (pfVar6 != (float *)local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_3b8,1,(value_type *)local_b58,(allocator_type *)local_a70);
  ref_text_line::ref_text_line(&local_390,0.0,24.0,109.1,&local_3b8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::push_back
            (&local_368,&local_390);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_350,&local_368);
  peVar1 = (local_b18->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (local_b18->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  local_270.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(4);
  local_270.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = local_270.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + 1;
  *local_270.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = 3;
  local_39c[1] = 3;
  local_270.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_270.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
            ((vector<int,std::allocator<int>> *)&local_270,
             (iterator)
             local_270.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish,local_39c + 1);
  std::vector<int,_std::allocator<int>_>::vector(&local_870,&local_270);
  local_b08[0xf] = 3;
  if (local_870.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_870.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_870,
               (iterator)
               local_870.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b08 + 0xf);
  }
  else {
    *local_870.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 3;
    local_870.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_870.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_858,&local_870);
  local_b08[0xe] = 3;
  if (local_858.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_858.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_858,
               (iterator)
               local_858.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b08 + 0xe);
  }
  else {
    *local_858.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 3;
    local_858.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_858.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_840,&local_858);
  local_b08[0xd] = 0;
  if (local_840.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_840.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_840,
               (iterator)
               local_840.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b08 + 0xd);
  }
  else {
    *local_840.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0;
    local_840.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_840.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_828,&local_840);
  local_b08[0xc] = 1;
  if (local_828.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_828.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_828,
               (iterator)
               local_828.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b08 + 0xc);
  }
  else {
    *local_828.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_828.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_828.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_810,&local_828);
  local_b08[0xb] = 1;
  if (local_810.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_810.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_810,
               (iterator)
               local_810.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b08 + 0xb);
  }
  else {
    *local_810.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_810.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_810.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_7f8,&local_810);
  local_b08[10] = 1;
  if (local_7f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_7f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_7f8,
               (iterator)
               local_7f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b08 + 10);
  }
  else {
    *local_7f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_7f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_7f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_7e0,&local_7f8);
  local_b08[9] = 1;
  if (local_7e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_7e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_7e0,
               (iterator)
               local_7e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b08 + 9);
  }
  else {
    *local_7e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_7e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_7e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_7c8,&local_7e0);
  local_a70 = SUB84(peVar1,0);
  fStack_a6c = (float)((ulong)peVar1 >> 0x20);
  rStack_a68 = SUB84(p_Var3,0);
  uStack_a64 = (undefined4)((ulong)p_Var3 >> 0x20);
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  local_a50._M_current = (positioned_glyph *)0x0;
  ppStack_a48 = (positioned_glyph *)0x0;
  local_a60._0_4_ = 0.0;
  local_a60._4_4_ = 0.0;
  prStack_a58 = (pointer)0x0;
  local_a40 = false;
  pfVar6 = (float *)CONCAT44(local_7c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             local_7c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._0_4_);
  if (pfVar6 != (float *)local_7c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish) {
    do {
      local_aa8 = (undefined1  [4])*pfVar6;
      fStack_aa4 = 0.0;
      rStack_aa0 = 0.0;
      if (local_a50._M_current == ppStack_a48) {
        std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
        _M_realloc_insert<agge::positioned_glyph_const&>
                  ((vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> *)
                   &prStack_a58,local_a50,(positioned_glyph *)local_aa8);
      }
      else {
        ((local_a50._M_current)->d).dy = 0.0;
        (local_a50._M_current)->index = (int)(ulong)(uint)local_aa8;
        ((local_a50._M_current)->d).dx = (float)(int)((ulong)(uint)local_aa8 >> 0x20);
        local_a50._M_current = local_a50._M_current + 1;
      }
      pfVar6 = pfVar6 + 1;
    } while (pfVar6 != (float *)local_7c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_3d0,1,(value_type *)local_a70,(allocator_type *)local_aa8);
  ref_text_line::ref_text_line(&local_2b0,0.0,38.0,103.1,&local_3d0);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::push_back
            (&local_350,&local_2b0);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_338,&local_350);
  peVar1 = (local_b18->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (local_b18->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(4);
  local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + 1;
  *local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = 1;
  local_39c[0] = 2;
  local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
            ((vector<int,std::allocator<int>> *)&local_288,
             (iterator)
             local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish,local_39c);
  std::vector<int,_std::allocator<int>_>::vector(&local_960,&local_288);
  local_b08[8] = 1;
  if (local_960.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_960.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_960,
               (iterator)
               local_960.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b08 + 8);
  }
  else {
    *local_960.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_960.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_960.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_948,&local_960);
  local_b08[7] = 2;
  if (local_948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_948,
               (iterator)
               local_948.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b08 + 7);
  }
  else {
    *local_948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_948.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_930,&local_948);
  local_b08[6] = 1;
  if (local_930.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_930.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_930,
               (iterator)
               local_930.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b08 + 6);
  }
  else {
    *local_930.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_930.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_930.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_918,&local_930);
  local_b08[5] = 2;
  if (local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_918,
               (iterator)
               local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b08 + 5);
  }
  else {
    *local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_900,&local_918);
  local_b08[4] = 1;
  if (local_900.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_900.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_900,
               (iterator)
               local_900.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b08 + 4);
  }
  else {
    *local_900.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_900.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_900.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_8e8,&local_900);
  local_b08[3] = 2;
  if (local_8e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_8e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_8e8,
               (iterator)
               local_8e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b08 + 3);
  }
  else {
    *local_8e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_8e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_8e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_8d0,&local_8e8);
  local_b08[2] = 1;
  if (local_8d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_8d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_8d0,
               (iterator)
               local_8d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b08 + 2);
  }
  else {
    *local_8d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_8d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_8d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_8b8,&local_8d0);
  local_b08[1] = 2;
  if (local_8b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_8b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_8b8,
               (iterator)
               local_8b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b08 + 1);
  }
  else {
    *local_8b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_8b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_8b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_8a0,&local_8b8);
  local_b08[0] = 5;
  if (local_8a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_8a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_8a0,
               (iterator)
               local_8a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b08);
  }
  else {
    *local_8a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 5;
    local_8a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_8a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_888,&local_8a0);
  local_aa8 = SUB84(peVar1,0);
  fStack_aa4 = (float)((ulong)peVar1 >> 0x20);
  rStack_aa0 = SUB84(this_00,0);
  uStack_a9c = (undefined4)((ulong)this_00 >> 0x20);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_a88._M_current = (positioned_glyph *)0x0;
  ppStack_a80 = (positioned_glyph *)0x0;
  local_a98._0_4_ = 0.0;
  local_a98._4_4_ = 0.0;
  prStack_a90 = (pointer)0x0;
  local_a78 = false;
  puVar4 = (uint *)CONCAT44(local_888.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_888.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (puVar4 != (uint *)local_888.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish) {
    do {
      local_a38 = (undefined1  [4])*puVar4;
      fStack_a34 = 0.0;
      local_a30 = 0.0;
      if (local_a88._M_current == ppStack_a80) {
        std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
        _M_realloc_insert<agge::positioned_glyph_const&>
                  ((vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> *)
                   &prStack_a90,local_a88,(positioned_glyph *)local_a38);
      }
      else {
        ((local_a88._M_current)->d).dy = 0.0;
        (local_a88._M_current)->index = (int)(ulong)(uint)local_a38;
        ((local_a88._M_current)->d).dx = (float)(int)((ulong)(uint)local_a38 >> 0x20);
        local_a88._M_current = local_a88._M_current + 1;
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != (uint *)local_888.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_3e8,1,(value_type *)local_aa8,(allocator_type *)local_a38);
  ref_text_line::ref_text_line(&local_2d8,0.0,52.0,118.0,&local_3e8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::push_back
            (&local_338,&local_2d8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_a10,&local_338);
  std::vector<agge::text_line,std::allocator<agge::text_line>>::
  vector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>,void>
            ((vector<agge::text_line,std::allocator<agge::text_line>> *)&local_400,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_1f8._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_1f8._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_finish,(allocator_type *)local_a38);
  local_420._0_8_ = (pointer)(local_420 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_420,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_a38,(string *)local_420,0x186);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_a10,&local_400,(LocationInfo *)local_a38);
  if ((undefined1 *)CONCAT44(fStack_a34,local_a38) != local_a28) {
    operator_delete((undefined1 *)CONCAT44(fStack_a34,local_a38));
  }
  if ((pointer)local_420._0_8_ != (pointer)(local_420 + 0x10)) {
    operator_delete((void *)local_420._0_8_);
  }
  this_01 = local_990;
  if ((void *)CONCAT44(local_400.
                       super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl
                       .super__Vector_impl_data._M_start._4_4_,
                       local_400.
                       super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl
                       .super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_400.
                                     super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_400.
                                     super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_a10);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_2d8._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_3e8);
  if (prStack_a90 != (pointer)0x0) {
    operator_delete(prStack_a90);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_a9c,rStack_aa0) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_a9c,rStack_aa0));
  }
  if ((void *)CONCAT44(local_888.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_888.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_888.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,
                                     local_888.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start._0_4_));
  }
  if (local_8a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_8a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_8b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_8b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_8d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_8d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_8e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_8e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_900.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_900.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_930.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_930.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_948.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_948.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_960.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_960.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_338);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_2b0._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_3d0);
  if (prStack_a58 != (pointer)0x0) {
    operator_delete(prStack_a58);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_a64,rStack_a68) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_a64,rStack_a68));
  }
  if ((void *)CONCAT44(local_7c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_7c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_7c8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,
                                     local_7c8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start._0_4_));
  }
  if (local_7e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_7e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_7f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_7f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_810.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_810.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_828.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_828.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_840.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_840.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_858.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_858.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_870.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_870.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_270.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_270.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_350);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_390._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_3b8);
  if ((void *)local_b48._8_8_ != (void *)0x0) {
    operator_delete((void *)local_b48._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_b4c,local_b50) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_b4c,local_b50));
  }
  if ((void *)CONCAT44(local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,
                                     local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start._0_4_));
  }
  if (local_708.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_708.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_720.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_720.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_738.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_738.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_750.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_750.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_768.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_768.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_780.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_780.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_798.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_798.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_7b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_7b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_368);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_988._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_5e8);
  if ((void *)local_9f8._24_8_ != (void *)0x0) {
    operator_delete((void *)local_9f8._24_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9f8._8_8_);
  }
  if ((void *)CONCAT44(local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,
                                     local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start._0_4_));
  }
  if (local_600.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_600.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_618.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_630.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_630.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_648.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_660.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_660.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_690.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_690.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_6a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_6a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_6c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_6c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_6d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_6d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (local_1f8._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
      _M_impl.super__Vector_impl_data._M_start != (text_line *)0x0) {
    operator_delete(local_1f8._text_lines.
                    super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<agge::glyph_run,_std::allocator<agge::glyph_run>_>::~vector(&local_1f8._glyph_runs);
  if (local_1f8._glyphs._begin != (positioned_glyph *)0x0) {
    operator_delete__(local_1f8._glyphs._begin);
  }
  if (local_1a8._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
      _M_impl.super__Vector_impl_data._M_start != (text_line *)0x0) {
    operator_delete(local_1a8._text_lines.
                    super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<agge::glyph_run,_std::allocator<agge::glyph_run>_>::~vector(&local_1a8._glyph_runs);
  if (local_1a8._glyphs._begin != (positioned_glyph *)0x0) {
    operator_delete__(local_1a8._glyphs._begin);
  }
  if (local_b10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b10);
  }
  lVar5 = 0xd8;
  do {
    if (*(void **)((long)local_128 + lVar5) != (void *)0x0) {
      operator_delete(*(void **)((long)local_128 + lVar5));
    }
    lVar5 = lVar5 + -0x28;
  } while (lVar5 != -0x18);
  return;
}

Assistant:

test( LongSingleLineIsBrokenOnWordBounds )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = {
					{ L' ', 0 }, { L'A', 1 }, { L'B', 2 }, { L'C', 3 }, { L'\'', 4 }, { L'.', 5 },
				};
				mocks::font_accessor::glyph glyphs[] = {
					{ { 7.1, 0 } },
					{ { 11, 0 } },
					{ { 12, 0 } },
					{ { 13, 0 } },
					{ { 3, 0 } },
					{ { 3, 0 } },
				};
				factory_ptr f = create_single_font_factory(c_fm1, indices, glyphs);
				layout::const_iterator gr;

				layout l1;
				layout l2;

				// ACT
				// 44 + 7.1 + 48 + 7.1 + 26 + 7.1 + 48 + 7.1 + 44
				// AAAA BBBB CC|BBBB AAAA
				l1.process (R("AAAA BBBB CC BBBB AAAA"), limit::wrap(139.1f), *f);

				// 55 + 7.1 + 36 + 7.1 + 22 + 7.1 + 22 + 7.1 + 80 + 7.1 + 52 + 7.1 + 44 + 7.1 + 118
				// CCC'C BBB AA|AA AAAABBB|CCCC AAAA|ABABABABAB.
				l2.process(R("CCC'C BBB AA AA AAAABBB CCCC AAAA ABABABABAB."), limit::wrap(139.1f), *f);

				// ASSERT
				assert_equal(plural
					+ ref_text_line(0.0f, 10.0f, 132.2f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 1 + 1 + 1 + 1 + 0 + 2 + 2 + 2 + 2 + 0 + 3 + 3))
					+ ref_text_line(0.0f, 24.0f, 99.1f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 2 + 2 + 2 + 2 + 0 + 1 + 1 + 1 + 1)),
					mkvector(l1.begin(), l1.end()));

				assert_equal(plural
					+ ref_text_line(0.0f, 10.0f, 127.2f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 3 + 3 + 3 + 4 + 3 + 0 + 2 + 2 + 2 + 0 + 1 + 1))
					+ ref_text_line(0.0f, 24.0f, 109.1f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 1 + 1 + 0 + 1 + 1 + 1 + 1 + 2 + 2 + 2))
					+ ref_text_line(0.0f, 38.0f, 103.1f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 3 + 3 + 3 +3 + 0 + 1 + 1 + 1 + 1))
					+ ref_text_line(0.0f, 52.0f, 118.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 1 + 2 + 1 + 2 + 1 + 2 + 1 + 2 + 1 + 2 + 5)),
					mkvector(l2.begin(), l2.end()));
			}